

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  function_record *r;
  process_attribute<pybind11::arg_v,_void> *__args_4;
  process_attribute<pybind11::arg_v,_void> *a;
  bool *in_stack_ffffffffffffffc8;
  EVP_PKEY_CTX *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  handle in_stack_ffffffffffffffe0;
  char (*in_stack_ffffffffffffffe8) [5];
  ulong uVar3;
  
  if (((*(ushort *)(ctx + 0x59) >> 4 & 1) != 0) &&
     (bVar1 = std::
              vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ::empty((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)in_stack_ffffffffffffffd0), bVar1)) {
    in_stack_ffffffffffffffd0 = ctx + 0x18;
    in_stack_ffffffffffffffe8 = (char (*) [5])0x0;
    memset(&stack0xffffffffffffffe0,0,8);
    pybind11::handle::handle((handle *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffdf = 1;
    in_stack_ffffffffffffffde = 0;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)ctx,in_stack_ffffffffffffffe8,(void **)in_stack_ffffffffffffffe0.m_ptr,
               (handle *)
               CONCAT17(1,(uint7)CONCAT15(in_stack_ffffffffffffffdd,
                                          CONCAT14(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8))),
               (bool *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  bVar1 = pybind11::handle::operator_cast_to_bool((handle *)(this + 0x10));
  if (bVar1) {
    r = (function_record *)(ctx + 0x18);
    __args_4 = this + 0x18;
    a = this;
    pybind11::handle::inc_ref((handle *)this);
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool,bool_const&>
              ((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)ctx,(char **)in_stack_ffffffffffffffe8,(char **)in_stack_ffffffffffffffe0.m_ptr,
               (handle *)
               ((CONCAT17(in_stack_ffffffffffffffdf,
                          CONCAT16(in_stack_ffffffffffffffde,
                                   CONCAT15(this[8],CONCAT14((byte)this[8] >> 1,
                                                             in_stack_ffffffffffffffd8)))) &
                 0xffff0101ffffffff ^ 0xff0000000000) & 0xffff01ffffffffff),
               (bool *)in_stack_ffffffffffffffd0,(bool *)__args_4);
    uVar3 = CONCAT62((int6)((ulong)ctx >> 0x10),*(ushort *)(ctx + 0x59) >> 7) & 0xffffffffffff0001;
    iVar2 = (int)uVar3;
    if ((short)uVar3 != 0) {
      process_kw_only_arg((arg *)a,r);
      iVar2 = extraout_EAX;
    }
    return iVar2;
  }
  pybind11_fail((char *)in_stack_ffffffffffffffd0);
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/, false /*none not allowed*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert, a.flag_none);

        if (r->has_kw_only_args) process_kw_only_arg(a, r);
    }